

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O1

void __thiscall
AVSInterface::AVSInDelegator::Read
          (AVSInDelegator *this,char *name,vector<long,_std::allocator<long>_> *output)

{
  iterator __position;
  char cVar1;
  int iVar2;
  int iVar3;
  AVSValue *pAVar4;
  code *pcVar5;
  undefined8 *puVar6;
  int iVar7;
  long *plVar8;
  AVSValue arg;
  long local_48;
  AVSValue local_40;
  
  pAVar4 = &this->_args;
  iVar2 = NameToIndex(this,name);
  if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x508 < (uint)AVS_linkage->Size)) {
    pcVar5 = (code *)AVS_linkage->AVSValue_OPERATOR_INDEX;
    plVar8 = (long *)((long)&pAVar4->type + *(long *)&AVS_linkage->field_0x510);
    if (((ulong)pcVar5 & 1) != 0) {
      pcVar5 = *(code **)(pcVar5 + *plVar8 + -1);
    }
    pAVar4 = (AVSValue *)(*pcVar5)(plVar8,iVar2);
  }
  if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x4d8 < (uint)AVS_linkage->Size)) {
    pcVar5 = (code *)AVS_linkage->AVSValue_CONSTRUCTOR9;
    plVar8 = (long *)((long)&local_40.type + *(long *)&AVS_linkage->field_0x4e0);
    if (((ulong)pcVar5 & 1) != 0) {
      pcVar5 = *(code **)(pcVar5 + *plVar8 + -1);
    }
    (*pcVar5)(plVar8,pAVar4);
  }
  if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x578 < (uint)AVS_linkage->Size)) {
    pcVar5 = (code *)AVS_linkage->IsArray;
    if (((ulong)pcVar5 & 1) != 0) {
      pcVar5 = *(code **)(pcVar5 + *(long *)((long)&local_40.type +
                                            *(long *)&AVS_linkage->field_0x580) + -1);
    }
    cVar1 = (*pcVar5)();
    if (cVar1 != '\0') {
      iVar2 = 0;
      if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x628 < (uint)AVS_linkage->Size)) {
        pcVar5 = (code *)AVS_linkage->ArraySize;
        if (((ulong)pcVar5 & 1) != 0) {
          pcVar5 = *(code **)(pcVar5 + *(long *)((long)&local_40.type +
                                                *(long *)&AVS_linkage->field_0x630) + -1);
        }
        iVar2 = (*pcVar5)();
      }
      if (*(long *)(output + 8) != *(long *)output) {
        *(long *)(output + 8) = *(long *)output;
      }
      if (0 < iVar2) {
        iVar7 = 0;
        do {
          pAVar4 = &local_40;
          if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x508 < (uint)AVS_linkage->Size)) {
            pcVar5 = (code *)AVS_linkage->AVSValue_OPERATOR_INDEX;
            plVar8 = (long *)((long)&local_40.type + *(long *)&AVS_linkage->field_0x510);
            if (((ulong)pcVar5 & 1) != 0) {
              pcVar5 = *(code **)(pcVar5 + *plVar8 + -1);
            }
            pAVar4 = (AVSValue *)(*pcVar5)(plVar8,iVar7);
          }
          iVar3 = 0;
          if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x5a8 < (uint)AVS_linkage->Size)) {
            pcVar5 = (code *)AVS_linkage->AsInt1;
            plVar8 = (long *)((long)&pAVar4->type + *(long *)&AVS_linkage->field_0x5b0);
            if (((ulong)pcVar5 & 1) != 0) {
              pcVar5 = *(code **)(pcVar5 + *plVar8 + -1);
            }
            iVar3 = (*pcVar5)(plVar8);
          }
          local_48 = (long)iVar3;
          __position._M_current = *(long **)(output + 8);
          if (__position._M_current == *(long **)(output + 0x10)) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (output,__position,&local_48);
          }
          else {
            *__position._M_current = local_48;
            *(long **)(output + 8) = __position._M_current + 1;
          }
          iVar7 = iVar7 + 1;
        } while (iVar2 != iVar7);
      }
      AVSValue::~AVSValue(&local_40);
      return;
    }
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "Argument is not array";
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

void Read(const char* name, std::vector<int64_t>& output) override {
      auto arg = _args[NameToIndex(name)];
      if (!arg.IsArray())
        throw "Argument is not array";
      auto size = arg.ArraySize();
      output.clear();
      for (int i = 0; i < size; i++)
        output.push_back(arg[i].AsInt());
    }